

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetPreprocessedFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *config)

{
  bool bVar1;
  string *psVar2;
  cmGlobalNinjaGenerator *pcVar3;
  ulong uVar4;
  ulong uVar5;
  char local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  undefined1 local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string ppName;
  string *objExt;
  string *objName;
  string_view local_58;
  undefined1 local_48 [8];
  string ppExt;
  string *config_local;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  string *path;
  
  ppExt.field_2._8_8_ = config;
  psVar2 = cmSourceFile::GetExtension_abi_cxx11_(source);
  std::__cxx11::string::string((string *)local_48,(string *)psVar2);
  local_58 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
  bVar1 = cmHasLiteralPrefix<2ul>(local_58,(char (*) [2])0x12207f0);
  if (bVar1) {
    cmsys::SystemTools::LowerCase((string *)&objName,(string *)local_48);
    std::__cxx11::string::operator=((string *)local_48,(string *)&objName);
    std::__cxx11::string::~string((string *)&objName);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,"fpp");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_48,"f");
  }
  psVar2 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
  pcVar3 = GetGlobalGenerator(this);
  cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
            ((string *)((long)&ppName.field_2 + 8),(cmGlobalGenerator *)pcVar3,source);
  uVar4 = std::__cxx11::string::size();
  uVar5 = std::__cxx11::string::size();
  if (uVar5 <= uVar4) {
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)psVar2);
    cmStrCat<std::__cxx11::string,char_const(&)[5],std::__cxx11::string&>
              ((string *)local_d8,&local_f8,(char (*) [5])"-pp.",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::string::~string((string *)&local_f8);
    local_f9 = 0;
    cmLocalNinjaGenerator::GetHomeRelativeOutputPath_abi_cxx11_
              (__return_storage_ptr__,this->LocalGenerator);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
    }
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      super_cmOutputConverter._vptr_cmOutputConverter[0x10])
              (&local_140,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget
              );
    pcVar3 = GetGlobalGenerator(this);
    (*(pcVar3->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d])
              (&local_160,pcVar3,ppExt.field_2._8_8_);
    local_161 = '/';
    cmStrCat<std::__cxx11::string,std::__cxx11::string,char,std::__cxx11::string_const&>
              (&local_120,&local_140,&local_160,&local_161,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_140);
    local_f9 = 1;
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)(ppName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_48);
    return __return_storage_ptr__;
  }
  __assert_fail("objName.size() >= objExt.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx"
                ,0x1eb,
                "std::string cmNinjaTargetGenerator::GetPreprocessedFilePath(const cmSourceFile *, const std::string &) const"
               );
}

Assistant:

std::string cmNinjaTargetGenerator::GetPreprocessedFilePath(
  cmSourceFile const* source, const std::string& config) const
{
  // Choose an extension to compile already-preprocessed source.
  std::string ppExt = source->GetExtension();
  if (cmHasLiteralPrefix(ppExt, "F")) {
    // Some Fortran compilers automatically enable preprocessing for
    // upper-case extensions.  Since the source is already preprocessed,
    // use a lower-case extension.
    ppExt = cmSystemTools::LowerCase(ppExt);
  }
  if (ppExt == "fpp") {
    // Some Fortran compilers automatically enable preprocessing for
    // the ".fpp" extension.  Since the source is already preprocessed,
    // use the ".f" extension.
    ppExt = "f";
  }

  // Take the object file name and replace the extension.
  std::string const& objName = this->GeneratorTarget->GetObjectName(source);
  std::string const& objExt =
    this->GetGlobalGenerator()->GetLanguageOutputExtension(*source);
  assert(objName.size() >= objExt.size());
  std::string const ppName =
    cmStrCat(objName.substr(0, objName.size() - objExt.size()), "-pp.", ppExt);

  std::string path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += '/';
  }
  path +=
    cmStrCat(this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             this->GetGlobalGenerator()->ConfigDirectory(config), '/', ppName);
  return path;
}